

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall Component_construct_Test::Component_construct_Test(Component_construct_Test *this)

{
  Component_construct_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Component_construct_Test_0015a380;
  return;
}

Assistant:

TEST(Component, construct)
{
    const std::string validName = "valid_name";

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName(validName);

    EXPECT_EQ("valid_name", v1->name());

    auto v2 = libcellml::Variable::create(validName);
    EXPECT_EQ("valid_name", v2->name());
}